

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void box_cb(Fl_Choice *i,void *v)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  Fl_Widget_Type *q;
  Fl_Type *o;
  int n_1;
  int m;
  int mod;
  int j;
  int n;
  void *v_local;
  Fl_Choice *i_local;
  
  if ((char *)v == "LOAD") {
    iVar2 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x1e])();
    if (iVar2 == 0) {
      Fl_Widget::activate((Fl_Widget *)i);
      mod = Fl_Widget::box(current_widget->o);
      if (mod == FL_NO_BOX) {
        mod = 1000;
      }
      for (m = 0; m < 0x3d; m = m + 1) {
        lVar3 = Fl_Menu_Item::argument(boxmenu + m);
        if (lVar3 == mod) {
          Fl_Choice::value(i,m);
          return;
        }
      }
    }
    else {
      Fl_Widget::deactivate((Fl_Widget *)i);
    }
  }
  else {
    bVar1 = false;
    iVar2 = Fl_Choice::value(i);
    lVar3 = Fl_Menu_Item::argument(boxmenu + iVar2);
    o._4_4_ = (Fl_Boxtype)lVar3;
    if (o._4_4_ != FL_NO_BOX) {
      if (o._4_4_ == 1000) {
        o._4_4_ = FL_NO_BOX;
      }
      for (q = (Fl_Widget_Type *)Fl_Type::first; q != (Fl_Widget_Type *)0x0;
          q = (Fl_Widget_Type *)(q->super_Fl_Type).next) {
        if (((q->super_Fl_Type).selected != '\0') &&
           (iVar2 = (*(q->super_Fl_Type)._vptr_Fl_Type[0x17])(), iVar2 != 0)) {
          Fl_Widget::box(q->o,o._4_4_);
          Fl_Widget_Type::redraw(q);
          bVar1 = true;
        }
      }
      if (bVar1) {
        set_modflag(1);
      }
    }
  }
  return;
}

Assistant:

void box_cb(Fl_Choice* i, void *v) {
  if (v == LOAD) {
    if (current_widget->is_menu_item()) {i->deactivate(); return;} else i->activate();
    int n = current_widget->o->box(); if (!n) n = ZERO_ENTRY;
    for (int j = 0; j < int(sizeof(boxmenu)/sizeof(*boxmenu)); j++)
      if (boxmenu[j].argument() == n) {i->value(j); break;}
  } else {
    int mod = 0;
    int m = i->value();
    int n = int(boxmenu[m].argument());
    if (!n) return; // should not happen
    if (n == ZERO_ENTRY) n = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
        q->o->box((Fl_Boxtype)n);
        q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}